

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O3

int cmime_part_from_file(CMimePart_T **part,char *filename,char *nl)

{
  CMimePart_T **ppCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CMimeInfo_T *mi;
  char *pcVar5;
  FILE *__stream;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  CMimePart_T **ppCVar9;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 local_100 [8];
  stat fileinfo;
  uchar local_64 [4];
  CMimePart_T **ppCStack_60;
  uchar out [4];
  char *local_50;
  char *ptemp;
  ulong local_40;
  uchar local_33 [8];
  uchar in [3];
  
  local_50 = (char *)0x0;
  ppCStack_60 = part;
  if (*part == (CMimePart_T *)0x0) {
    __assert_fail("(*part)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xea,"int cmime_part_from_file(CMimePart_T **, char *, const char *)");
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xeb,"int cmime_part_from_file(CMimePart_T **, char *, const char *)");
  }
  iVar2 = stat(filename,(stat *)local_100);
  iVar3 = -1;
  if ((iVar2 == 0) && (iVar3 = -2, ((uint)fileinfo.st_nlink & 0xf000) == 0x8000)) {
    if (nl == (char *)0x0) {
      nl = _cmime_internal_determine_linebreak_from_file(filename);
    }
    ptemp = nl;
    mi = cmime_util_info_get_from_file(filename);
    pcVar11 = mi->mime_encoding;
    iVar2 = strcmp(pcVar11,"binary");
    ppCVar9 = ppCStack_60;
    pcVar5 = mi->mime_type;
    if (iVar2 == 0) {
      pcVar11 = __xpg_basename(filename);
      pcVar10 = "%s;%s\tname=%s%s";
    }
    else {
      pcVar10 = "%s;%s\tcharset=%s%s";
    }
    asprintf(&local_50,pcVar10,pcVar5,ptemp,pcVar11,ptemp);
    cmime_util_info_free(mi);
    cmime_part_set_content_type(*ppCVar9,local_50);
    pcVar11 = local_50;
    iVar2 = strncmp(local_50,"text/plain",10);
    if (iVar2 == 0) {
      pcVar5 = strstr(pcVar11,"ascii");
      free(pcVar11);
      pcVar11 = "7bit%s";
      if (pcVar5 == (char *)0x0) {
        pcVar11 = "8bit%s";
      }
    }
    else {
      free(pcVar11);
      pcVar11 = "base64%s";
    }
    pcVar5 = ptemp;
    asprintf(&local_50,pcVar11,ptemp);
    cmime_part_set_content_transfer_encoding(*ppCVar9,local_50);
    free(local_50);
    pcVar11 = __xpg_basename(filename);
    asprintf(&local_50,"attachment;%s\tfilename=%s%s",pcVar5,pcVar11,pcVar5);
    cmime_part_set_content_disposition(*ppCVar9,local_50);
    free(local_50);
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      iVar3 = -3;
      pcVar11 = "libcmime: error opening file";
    }
    else {
      pcVar11 = (char *)calloc(1,1);
      (*ppCVar9)->content = pcVar11;
      iVar3 = feof(__stream);
      if (iVar3 == 0) {
        uVar13 = 0;
        uVar14 = 0;
        do {
          lVar12 = 0;
          iVar3 = 0;
          local_40 = uVar14;
          do {
            iVar4 = fgetc(__stream);
            local_33[lVar12] = (uchar)iVar4;
            iVar4 = feof(__stream);
            if (iVar4 == 0) {
              iVar3 = iVar3 + 1;
            }
            else {
              local_33[lVar12] = '\0';
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 3);
          uVar14 = local_40;
          if (iVar3 == 0) {
LAB_0010a164:
            iVar3 = feof(__stream);
            uVar8 = (uint)uVar14;
            if (iVar3 != 0) goto LAB_0010a177;
          }
          else {
            lVar12 = (long)(int)uVar13;
            if (iVar2 == 0) {
              pcVar11 = (*ppCVar9)->content;
              sVar6 = strlen(pcVar11);
              pcVar11 = (char *)realloc(pcVar11,sVar6 + 5);
              (*ppCVar9)->content = pcVar11;
              lVar7 = 0;
              iVar3 = (int)local_40;
              do {
                (*ppCVar9)->content[lVar7 + lVar12] = local_33[lVar7];
                lVar7 = lVar7 + 1;
              } while (lVar7 != 3);
            }
            else {
              cmime_base64_encode_block(local_33,local_64,iVar3);
              pcVar11 = (*ppCVar9)->content;
              sVar6 = strlen(pcVar11);
              pcVar11 = (char *)realloc(pcVar11,sVar6 + 6);
              (*ppCVar9)->content = pcVar11;
              lVar7 = 0;
              iVar3 = (int)local_40;
              do {
                (*ppCVar9)->content[lVar7 + lVar12] = local_64[lVar7];
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              lVar7 = 4;
            }
            uVar13 = lVar12 + lVar7;
            (*ppCVar9)->content[(int)uVar13] = '\0';
            uVar8 = iVar3 + 1;
            uVar14 = (ulong)uVar8;
            if (iVar3 < 0x11) goto LAB_0010a164;
LAB_0010a177:
            uVar14 = 0;
            if ((iVar2 != 0) && (uVar8 != 0)) {
              pcVar11 = (*ppCVar9)->content;
              local_40 = uVar13;
              fileinfo.__glibc_reserved[2] = strlen(pcVar11);
              pcVar5 = ptemp;
              sVar6 = strlen(ptemp);
              pcVar10 = (char *)realloc(pcVar11,fileinfo.__glibc_reserved[2] + sVar6 + 1);
              pcVar11 = ptemp;
              ppCVar1 = ppCStack_60;
              (*ppCVar9)->content = pcVar10;
              uVar13 = local_40;
              if (*pcVar5 != '\0') {
                lVar12 = (long)(int)local_40;
                uVar13 = 0;
                do {
                  (*ppCVar1)->content[uVar13 + lVar12] = pcVar11[uVar13];
                  uVar13 = uVar13 + 1;
                  sVar6 = strlen(pcVar11);
                } while (uVar13 < sVar6);
                uVar13 = (ulong)(uint)((int)local_40 + (int)uVar13);
              }
              uVar14 = 0;
              (*ppCStack_60)->content[(int)uVar13] = '\0';
              ppCVar9 = ppCStack_60;
            }
          }
          iVar3 = feof(__stream);
        } while (iVar3 == 0);
      }
      iVar2 = fclose(__stream);
      iVar3 = 0;
      if (iVar2 == 0) {
        return 0;
      }
      pcVar11 = "libcmime: error closing file";
    }
    perror(pcVar11);
  }
  return iVar3;
}

Assistant:

int cmime_part_from_file(CMimePart_T **part, char *filename, const char *nl) {
    struct stat fileinfo;
    int retval = 0;
    FILE *fp = NULL;
    int encode = 0;
    int i = 0;
    int len = 0;
    int blocksout = 0;
    int pos = 0;
    unsigned char in[3], out[4];
    char *ptemp = NULL;
    CMimeInfo_T *mi = NULL;

    assert((*part));
    assert(filename);

    /* only regular files please */
    retval = stat(filename,&fileinfo);
    if (retval == 0) {
        if(S_ISREG(fileinfo.st_mode)) {
            if (nl == NULL) 
                nl = _cmime_internal_determine_linebreak_from_file(filename);
            
            mi = cmime_util_info_get_from_file(filename);
            if (strcmp(mi->mime_encoding,"binary")==0) 
                asprintf(&ptemp,"%s;%s\tname=%s%s",mi->mime_type,nl,basename(filename),nl);
            else 
                asprintf(&ptemp,"%s;%s\tcharset=%s%s",mi->mime_type,nl,mi->mime_encoding,nl);
            
            cmime_util_info_free(mi);
            cmime_part_set_content_type((*part),ptemp);
            encode = (strncmp(ptemp,MIMETYPE_TEXT_PLAIN,strlen(MIMETYPE_TEXT_PLAIN)) == 0) ? 0 : 1;
            
                    
            if (encode == 1) {
                free(ptemp);
                asprintf(&ptemp,"base64%s",nl);
            } else {
                if (strstr(ptemp,"ascii")!=NULL) {
                    free(ptemp);
                    asprintf(&ptemp,"7bit%s",nl);
                } else {
                    free(ptemp);
                    asprintf(&ptemp,"8bit%s",nl);
                }
            }

            cmime_part_set_content_transfer_encoding((*part),ptemp);
            free(ptemp);
            
            asprintf(&ptemp,"attachment;%s\tfilename=%s%s",nl,basename(filename),nl);
            cmime_part_set_content_disposition((*part),ptemp);      
            free(ptemp);
            
            fp = fopen(filename, "rb");
            if (fp != NULL) {
                (*part)->content = (char *)calloc(1,sizeof(char));
                while(!feof(fp)) {
                    len = 0;
                    
                    for(i=0; i<3; i++) {
                        in[i] = (unsigned char)fgetc(fp);

                        if(!feof(fp)) {
                            len++;
                        } else {
                            in[i] = 0;
                        }
                    }

                    if (len) {
                        if (encode == 0) {
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + sizeof(in) + sizeof(char) +1);
                            for(i=0; i<3; i++) {
                                (*part)->content[pos++] = in[i];    
                            }
                            (*part)->content[pos] = '\0';
                        } else {
                            cmime_base64_encode_block(in,out,len);
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + sizeof(out) + sizeof(char) + 1);
                            for (i=0; i<4;i++) {
                                (*part)->content[pos++] = out[i];
                            }
                            (*part)->content[pos] = '\0';                       
                        }
                        blocksout++;
                    }

                    if(blocksout >= (LINE_LENGTH / 4) || feof(fp)) {
                        if(blocksout && (encode == 1)) {
                            /* if base64 data, we need to do a line break after LINE_LENGTH chars */
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + strlen(nl) + sizeof(char));
                            
                            for (i=0; i<strlen(nl);i++) {
                                (*part)->content[pos++] = nl[i];    
                            }
                            (*part)->content[pos] = '\0';
                        }
                    blocksout = 0;
                    } 
                }
                if (fclose(fp)!=0)
                    perror("libcmime: error closing file");
            } else {
                perror("libcmime: error opening file");
                return (-3); /* failed to open file */
            }           
        } else {
            return(-2); /* not regular file */
        } 
    } else {
        return(-1); /* stat error */
    }
    
    return(0);
}